

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

OptionStatus
setLocalOptionValue(HighsLogOptions *report_log_options,string *name,HighsLogOptions *log_options,
                   vector<OptionRecord_*,_std::allocator<OptionRecord_*>_> *option_records,
                   char *value)

{
  OptionStatus OVar1;
  string value_as_string;
  allocator local_71;
  string local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  std::__cxx11::string::string((string *)&local_50,value,&local_71);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_50,local_50 + local_48);
  OVar1 = setLocalOptionValue(report_log_options,name,log_options,option_records,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return OVar1;
}

Assistant:

OptionStatus setLocalOptionValue(const HighsLogOptions& report_log_options,
                                 const std::string& name,
                                 HighsLogOptions& log_options,
                                 std::vector<OptionRecord*>& option_records,
                                 const char* value) {
  // Handles values passed as explicit values in quotes
  std::string value_as_string(value);
  return setLocalOptionValue(report_log_options, name, log_options,
                             option_records, value_as_string);
}